

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-builder.h
# Opt level: O2

void __thiscall
mp::ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_>::SetComplementarity
          (ProblemBuilder<TestProblemBuilder,_BasicTestExpr<0>_> *this,int con_index,int var_index,
          ComplInfo info)

{
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"complementarity constraint",&local_31);
  TestProblemBuilder::ReportUnhandledConstruct((TestProblemBuilder *)this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void SetComplementarity(int con_index, int var_index, ComplInfo info) {
    internal::Unused(con_index, var_index, &info);
    MP_DISPATCH(ReportUnhandledConstruct("complementarity constraint"));
  }